

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O0

void __thiscall sisl::utility::ppm_image::ppm_image(ppm_image *this,int *width,int *height)

{
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  uint local_4c;
  uint local_48;
  int j;
  int i;
  int local_34;
  undefined1 local_30 [8];
  vector z;
  int *height_local;
  int *width_local;
  ppm_image *this_local;
  
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (Index)height;
  array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::array_n(&this->m_aArray,*width,(ulong)(uint)*height);
  this->m_iHeight =
       *(int *)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  this->m_iWidth = *width;
  local_34 = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_30,&local_34);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  for (local_48 = 0; (int)local_48 < *width; local_48 = local_48 + 1) {
    for (local_4c = 0;
        (int)local_4c <
        *(int *)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_4c = local_4c + 1) {
      this_00 = array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::operator()(&this->m_aArray,local_48,(ulong)local_4c);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (this_00,(Matrix<double,__1,_1,_0,__1,_1> *)local_30);
    }
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return;
}

Assistant:

ppm_image(const int &width, const int &height) : m_iHeight(height),
                                                             m_iWidth(width),
                                                             m_aArray(width, height) {
                // Clear out the internal memory
                vector z(3);
                z.setZero();

                for(int i = 0; i < width; i++) {
                    for(int j = 0; j < height; j++) {
                        m_aArray(i,j) = z;
                    }
                }
            }